

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

void Gia_ObjSetLevel(Gia_Man_t *p,Gia_Obj_t *pObj,int l)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  p_00 = p->vLevels;
  Vec_IntFillExtra(p_00,uVar2 + 1,l);
  if ((-1 < (int)uVar2) && ((int)uVar2 < p_00->nSize)) {
    p_00->pArray[uVar2 & 0x7fffffff] = l;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline int          Gia_ObjId( Gia_Man_t * p, Gia_Obj_t * pObj )        { assert( p->pObjs <= pObj && pObj < p->pObjs + p->nObjs ); return pObj - p->pObjs; }